

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsValidation.cpp
# Opt level: O2

bool __thiscall
chrono::utils::ChValidation::Process(ChValidation *this,Data *sim_data,Data *ref_data)

{
  _Expr<std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_ValArray,_double,_double>,_double>
  *__e;
  pointer pvVar1;
  pointer pvVar2;
  size_t sVar3;
  pointer pvVar4;
  pointer this_00;
  valarray<double> *this_01;
  size_t col_1;
  size_type __new_size;
  char *pcVar5;
  ChValidation *pCVar6;
  ostream *poVar7;
  long lVar8;
  size_t col;
  ulong uVar9;
  long lVar10;
  double dVar11;
  undefined1 local_80 [48];
  pointer local_50;
  pointer local_48;
  valarray<double> *local_40;
  valarray<double> *local_38;
  
  std::valarray<double>::resize(&this->m_L2_norms,0,0.0);
  std::valarray<double>::resize(&this->m_RMS_norms,0,0.0);
  std::valarray<double>::resize(&this->m_INF_norms,0,0.0);
  pvVar1 = (sim_data->
           super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (sim_data->
           super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  __new_size = (long)pvVar1 - (long)pvVar2 >> 4;
  this->m_num_cols = __new_size;
  if (pvVar1 == pvVar2) {
    poVar7 = (ostream *)&std::cout;
    pcVar5 = "ERROR: no values in simulation data structure.";
  }
  else {
    sVar3 = pvVar2->_M_size;
    this->m_num_rows = sVar3;
    pvVar4 = (ref_data->
             super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)pvVar1 - (long)pvVar2 ==
        (long)(ref_data->
              super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) {
      if (sVar3 == pvVar4->_M_size) {
        local_80._32_8_ = &this->m_sim_data;
        local_80._16_8_ = ref_data;
        local_48 = (pointer)&this->m_RMS_norms;
        local_40 = &this->m_L2_norms;
        local_38 = &this->m_INF_norms;
        std::vector<std::valarray<double>,_std::allocator<std::valarray<double>_>_>::resize
                  ((vector<std::valarray<double>,_std::allocator<std::valarray<double>_>_> *)
                   local_80._32_8_,__new_size);
        local_80._24_8_ = &this->m_ref_data;
        std::vector<std::valarray<double>,_std::allocator<std::valarray<double>_>_>::resize
                  ((vector<std::valarray<double>,_std::allocator<std::valarray<double>_>_> *)
                   local_80._24_8_,this->m_num_cols);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&this->m_sim_headers,this->m_num_cols);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&this->m_ref_headers,this->m_num_cols);
        lVar10 = 0;
        lVar8 = 0;
        for (uVar9 = 0; uVar9 < this->m_num_cols; uVar9 = uVar9 + 1) {
          std::valarray<double>::operator=
                    ((valarray<double> *)
                     ((long)&((((_Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                                 *)local_80._32_8_)->_M_impl).super__Vector_impl_data._M_start)->
                             _M_size + lVar10),
                     (valarray<double> *)
                     ((long)&((sim_data->
                              super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar10));
          std::valarray<double>::operator=
                    ((valarray<double> *)
                     ((long)&((((_Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                                 *)local_80._24_8_)->_M_impl).super__Vector_impl_data._M_start)->
                             _M_size + lVar10),
                     (valarray<double> *)
                     ((long)&((((_Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                                 *)local_80._16_8_)->_M_impl).super__Vector_impl_data._M_start)->
                             _M_size + lVar10));
          std::__cxx11::string::assign
                    ((char *)((long)&(((this->m_ref_headers).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar8));
          lVar8 = lVar8 + 0x20;
          lVar10 = lVar10 + 0x10;
        }
        local_80._40_8_ =
             (((_Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_> *)
              local_80._32_8_)->_M_impl).super__Vector_impl_data._M_start;
        local_50 = (pointer)(((_Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                               *)local_80._24_8_)->_M_impl).super__Vector_impl_data._M_start;
        pCVar6 = (ChValidation *)local_80;
        std::valarray<double>::
        valarray<std::__detail::_BinClos<std::__minus,std::_ValArray,std::_ValArray,double,double>>
                  ((valarray<double> *)local_80,
                   (_Expr<std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_ValArray,_double,_double>,_double>
                    *)(local_80 + 0x28));
        local_80._16_8_ = L2norm(pCVar6,(DataVector *)local_80);
        ::operator_delete((void *)local_80._8_8_);
        this_01 = local_38;
        this_00 = local_48;
        if ((double)local_80._16_8_ <= 1e-10) {
          std::valarray<double>::resize(local_40,this->m_num_cols - 1,0.0);
          std::valarray<double>::resize((valarray<double> *)this_00,this->m_num_cols - 1,0.0);
          std::valarray<double>::resize(this_01,this->m_num_cols - 1,0.0);
          lVar8 = 0x10;
          __e = (_Expr<std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_ValArray,_double,_double>,_double>
                 *)(local_80 + 0x28);
          for (uVar9 = 0; uVar9 < this->m_num_cols - 1; uVar9 = uVar9 + 1) {
            local_80._40_8_ =
                 (long)&((((_Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                            *)local_80._32_8_)->_M_impl).super__Vector_impl_data._M_start)->_M_size
                 + lVar8;
            local_50 = (pointer)((long)&((((_Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                                            *)local_80._24_8_)->_M_impl).super__Vector_impl_data.
                                        _M_start)->_M_size + lVar8);
            pCVar6 = (ChValidation *)local_80;
            std::valarray<double>::
            valarray<std::__detail::_BinClos<std::__minus,std::_ValArray,std::_ValArray,double,double>>
                      ((valarray<double> *)local_80,__e);
            dVar11 = L2norm(pCVar6,(DataVector *)local_80);
            (this->m_L2_norms)._M_data[uVar9] = dVar11;
            ::operator_delete((void *)local_80._8_8_);
            local_80._40_8_ =
                 (long)&((this->m_sim_data).
                         super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar8;
            local_50 = (pointer)((long)&((this->m_ref_data).
                                         super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar8
                                );
            pCVar6 = (ChValidation *)local_80;
            std::valarray<double>::
            valarray<std::__detail::_BinClos<std::__minus,std::_ValArray,std::_ValArray,double,double>>
                      ((valarray<double> *)local_80,__e);
            dVar11 = RMSnorm(pCVar6,(DataVector *)local_80);
            (this->m_RMS_norms)._M_data[uVar9] = dVar11;
            ::operator_delete((void *)local_80._8_8_);
            local_80._40_8_ =
                 (long)&((this->m_sim_data).
                         super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar8;
            local_50 = (pointer)((long)&((this->m_ref_data).
                                         super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar8
                                );
            pCVar6 = (ChValidation *)local_80;
            std::valarray<double>::
            valarray<std::__detail::_BinClos<std::__minus,std::_ValArray,std::_ValArray,double,double>>
                      ((valarray<double> *)local_80,__e);
            dVar11 = INFnorm(pCVar6,(DataVector *)local_80);
            (this->m_INF_norms)._M_data[uVar9] = dVar11;
            ::operator_delete((void *)local_80._8_8_);
            lVar8 = lVar8 + 0x10;
          }
          return true;
        }
        poVar7 = (ostream *)&std::cout;
        pcVar5 = "ERROR: time sequences do not match.";
        goto LAB_00e40799;
      }
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ERROR: the number of rows in the two structures is different:");
      std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::operator<<((ostream *)&std::cout,"   Simulation data has ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      pcVar5 = " rows";
      poVar7 = std::operator<<(poVar7," rows");
      std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::operator<<((ostream *)&std::cout,"   Reference data has ");
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "ERROR: the number of columns in the two structures is different:");
      std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::operator<<((ostream *)&std::cout,"   Simulation data has ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      pcVar5 = " columns";
      poVar7 = std::operator<<(poVar7," columns");
      std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::operator<<((ostream *)&std::cout,"   Reference data has ");
    }
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  }
LAB_00e40799:
  poVar7 = std::operator<<(poVar7,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar7);
  return false;
}

Assistant:

bool ChValidation::Process(const Data& sim_data, const Data& ref_data) {
    // Resize the arrays of norms to zero length
    // (needed if we return with an error below)
    m_L2_norms.resize(0);
    m_RMS_norms.resize(0);
    m_INF_norms.resize(0);

    // Read the simulation results file.
    m_num_cols = sim_data.size();
    if (m_num_cols < 1) {
        std::cout << "ERROR: no values in simulation data structure." << std::endl;
        return false;
    }

    m_num_rows = sim_data[0].size();

    // Perform some sanity checks.
    if (m_num_cols != ref_data.size()) {
        std::cout << "ERROR: the number of columns in the two structures is different:" << std::endl;
        std::cout << "   Simulation data has " << m_num_cols << " columns" << std::endl;
        std::cout << "   Reference data has " << ref_data.size() << " columns" << std::endl;
        return false;
    }

    if (m_num_rows != ref_data[0].size()) {
        std::cout << "ERROR: the number of rows in the two structures is different:" << std::endl;
        std::cout << "   Simulation data has " << m_num_rows << " rows" << std::endl;
        std::cout << "   Reference data has " << ref_data[0].size() << " rows" << std::endl;
        return false;
    }

    // Cache simulation and reference data. Set headers to empty values.
    m_sim_data.resize(m_num_cols);
    m_ref_data.resize(m_num_cols);
    m_sim_headers.resize(m_num_cols);
    m_ref_headers.resize(m_num_cols);
    for (size_t col = 0; col < m_num_cols; col++) {
        m_sim_data[col] = sim_data[col];
        m_ref_data[col] = ref_data[col];
        m_ref_headers[col] = "";
    }

    // Ensure that the first columns (time) are the same.
    if (L2norm(m_sim_data[0] - m_ref_data[0]) > 1e-10) {
        std::cout << "ERROR: time sequences do not match." << std::endl;
        return false;
    }

    // Resize arrays of norms.
    m_L2_norms.resize(m_num_cols - 1);
    m_RMS_norms.resize(m_num_cols - 1);
    m_INF_norms.resize(m_num_cols - 1);

    // Calculate norms of the differences.
    for (size_t col = 0; col < m_num_cols - 1; col++) {
        m_L2_norms[col] = L2norm(m_sim_data[col + 1] - m_ref_data[col + 1]);
        m_RMS_norms[col] = RMSnorm(m_sim_data[col + 1] - m_ref_data[col + 1]);
        m_INF_norms[col] = INFnorm(m_sim_data[col + 1] - m_ref_data[col + 1]);
    }

    return true;
}